

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

QLayoutStyleInfo * __thiscall
QGraphicsAnchorLayoutPrivate::styleInfo(QGraphicsAnchorLayoutPrivate *this)

{
  long lVar1;
  bool bVar2;
  QLayoutStyleInfo *pQVar3;
  double *pdVar4;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  QStyle *style;
  QGraphicsItem *parentItem;
  QGraphicsWidget *w;
  QGraphicsLayoutItem *parent;
  QWidget *wid;
  QGraphicsAnchorLayout *q;
  QLayoutStyleInfo *in_stack_ffffffffffffff18;
  Orientation o;
  QLayoutStyleInfo *in_stack_ffffffffffffff20;
  QGraphicsWidget *in_stack_ffffffffffffff28;
  QLayoutStyleInfo *this_00;
  QGraphicsItem *local_c8;
  bool local_b1;
  QGraphicsItem *local_98;
  QGraphicsLayoutItem *local_90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)in_RDI->field_0x2c0 >> 1 & 1) != 0) {
    q_func(in_RDI);
    local_90 = QGraphicsLayoutItem::parentLayoutItem((QGraphicsLayoutItem *)0x93e413);
    while( true ) {
      local_b1 = false;
      if (local_90 != (QGraphicsLayoutItem *)0x0) {
        local_b1 = QGraphicsLayoutItem::isLayout((QGraphicsLayoutItem *)0x93e430);
      }
      if (local_b1 == false) break;
      local_90 = QGraphicsLayoutItem::parentLayoutItem((QGraphicsLayoutItem *)0x93e448);
    }
    local_98 = (QGraphicsItem *)0x0;
    if (((local_90 != (QGraphicsLayoutItem *)0x0) &&
        (local_c8 = QGraphicsLayoutItem::graphicsItem((QGraphicsLayoutItem *)0x93e46a),
        local_c8 != (QGraphicsItem *)0x0)) &&
       (bVar2 = QGraphicsItem::isWidget((QGraphicsItem *)0x93e481), bVar2)) {
      if (local_c8 == (QGraphicsItem *)0x0) {
        local_c8 = (QGraphicsItem *)0x0;
      }
      else {
        local_c8 = local_c8 + -1;
      }
      local_98 = local_c8;
    }
    if (local_98 == (QGraphicsItem *)0x0) {
      pQVar3 = (QLayoutStyleInfo *)QApplication::style();
    }
    else {
      pQVar3 = (QLayoutStyleInfo *)QGraphicsWidget::style(in_stack_ffffffffffffff28);
    }
    QLayoutStyleInfo::QLayoutStyleInfo
              (pQVar3,(QStyle *)in_stack_ffffffffffffff28,(QWidget *)in_stack_ffffffffffffff20);
    QLayoutStyleInfo::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    o = (Orientation)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    QLayoutStyleInfo::~QLayoutStyleInfo((QLayoutStyleInfo *)0x93e51d);
    pQVar3 = &in_RDI->cachedStyleInfo;
    pdVar4 = QHVContainer<double>::operator[]((QHVContainer<double> *)pQVar3,o);
    QLayoutStyleInfo::setDefaultSpacing(pQVar3,Horizontal,*pdVar4);
    this_00 = &in_RDI->cachedStyleInfo;
    pdVar4 = QHVContainer<double>::operator[]((QHVContainer<double> *)pQVar3,o);
    QLayoutStyleInfo::setDefaultSpacing(this_00,Vertical,*pdVar4);
    in_RDI->field_0x2c0 = in_RDI->field_0x2c0 & 0xfd;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return &in_RDI->cachedStyleInfo;
}

Assistant:

QLayoutStyleInfo &QGraphicsAnchorLayoutPrivate::styleInfo() const
{
    if (styleInfoDirty) {
        Q_Q(const QGraphicsAnchorLayout);
        //### Fix this if QGV ever gets support for Metal style or different Aqua sizes.
        QWidget *wid = nullptr;

        QGraphicsLayoutItem *parent = q->parentLayoutItem();
        while (parent && parent->isLayout()) {
            parent = parent->parentLayoutItem();
        }
        QGraphicsWidget *w = nullptr;
        if (parent) {
            QGraphicsItem *parentItem = parent->graphicsItem();
            if (parentItem && parentItem->isWidget())
                w = static_cast<QGraphicsWidget*>(parentItem);
        }

        QStyle *style = w ? w->style() : QApplication::style();
        cachedStyleInfo = QLayoutStyleInfo(style, wid);
        cachedStyleInfo.setDefaultSpacing(Qt::Horizontal, spacings[Qt::Horizontal]);
        cachedStyleInfo.setDefaultSpacing(Qt::Vertical, spacings[Qt::Vertical]);

        styleInfoDirty = false;
    }
    return cachedStyleInfo;
}